

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.cpp
# Opt level: O2

shared_ptr<ComplexType> __thiscall SNMPPacket::generateVarBindList(SNMPPacket *this)

{
  __shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<BER_CONTAINER> *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long in_RSI;
  __shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *__r;
  shared_ptr<ComplexType> sVar5;
  shared_ptr<ComplexType> varBind;
  long local_88;
  undefined4 local_80 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_70._M_ptr._0_4_ = 0x30;
  sVar5 = std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)this);
  _Var3 = sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __r = *(__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x88);
  p_Var4 = *(__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x98);
  local_88 = *(long *)(in_RSI + 0xa0);
  p_Var1 = *(__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0xa8);
  while (__r != p_Var1) {
    local_80[0] = 0x30;
    std::make_shared<ComplexType,ASN_TYPE_WITH_VALUE>((ASN_TYPE_WITH_VALUE *)&local_70);
    psVar2 = (shared_ptr<BER_CONTAINER> *)CONCAT44(local_70._M_ptr._4_4_,local_70._M_ptr._0_4_);
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<OIDType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_80,__r);
    ComplexType::addValueToList((ComplexType *)(local_48 + 1),psVar2);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    ComplexType::addValueToList
              ((ComplexType *)(local_60 + 0x10),
               (shared_ptr<BER_CONTAINER> *)CONCAT44(local_70._M_ptr._4_4_,local_70._M_ptr._0_4_));
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
    psVar2 = (shared_ptr<BER_CONTAINER> *)this->_vptr_SNMPPacket;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)local_80,&local_70);
    ComplexType::addValueToList((ComplexType *)local_60,psVar2);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_refcount);
    __r = __r + 3;
    _Var3._M_pi = extraout_RDX;
    if (__r == p_Var4) {
      __r = *(__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> **)(local_88 + 8);
      local_88 = local_88 + 8;
      p_Var4 = __r + 0x1e;
    }
  }
  sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<ComplexType>)sVar5.super___shared_ptr<ComplexType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ComplexType> SNMPPacket::generateVarBindList(){
    SNMP_LOGD("generateVarBindList from SNMPPacket");
    // This is for normal packets where our response values have already been built, not traps
    auto varBindList = std::make_shared<ComplexType>(STRUCTURE);

    for(const auto& varBindItem : varbindList){
        auto varBind = std::make_shared<ComplexType>(STRUCTURE);

        varBind->addValueToList(varBindItem.oid);
        varBind->addValueToList(varBindItem.value);

        varBindList->addValueToList(varBind);
    }

    return varBindList;
}